

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

void __thiscall
InlineeFrameRecord::RestoreFrames
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *outerMostFrame,
          JavascriptCallStackLayout *callstack,bool boxValues)

{
  InlineeFrameRecord **ppIVar1;
  InlineeFrameRecord *pIVar2;
  uint uVar3;
  InlineeFrameRecord *pIVar4;
  InlineeFrameRecord *pIVar5;
  int iVar6;
  int iVar7;
  
  pIVar4 = (InlineeFrameRecord *)0x0;
  do {
    pIVar5 = this;
    this = pIVar5->parent;
    pIVar5->parent = pIVar4;
    pIVar4 = pIVar5;
  } while (this != (InlineeFrameRecord *)0x0);
  iVar6 = 1;
  uVar3 = *(uint *)&outerMostFrame->callInfo;
  while ((uVar3 & 0xf) != 0) {
    outerMostFrame = (InlinedFrameLayout *)(&outerMostFrame[1].callInfo + (uVar3 & 0xf));
    iVar6 = iVar6 + 1;
    uVar3 = *(uint *)&outerMostFrame->callInfo;
  }
  do {
    if (pIVar4->inlineDepth == iVar6) goto LAB_0055aefd;
    ppIVar1 = &pIVar4->parent;
    pIVar4 = *ppIVar1;
  } while (*ppIVar1 != (InlineeFrameRecord *)0x0);
LAB_0055af5f:
  pIVar4 = (InlineeFrameRecord *)0x0;
  do {
    pIVar2 = pIVar5->parent;
    pIVar5->parent = pIVar4;
    pIVar4 = pIVar5;
    pIVar5 = pIVar2;
  } while (pIVar2 != (InlineeFrameRecord *)0x0);
  return;
LAB_0055aefd:
  if (pIVar4->argCount == 0) {
    pIVar4 = pIVar4->parent;
    if (pIVar4 == (InlineeFrameRecord *)0x0) goto LAB_0055af5f;
  }
  else {
    Restore(pIVar4,functionBody,outerMostFrame,callstack,boxValues);
    pIVar4 = pIVar4->parent;
    if (pIVar4 == (InlineeFrameRecord *)0x0) goto LAB_0055af55;
  }
  for (iVar7 = iVar6; iVar7 != pIVar4->inlineDepth; iVar7 = iVar7 + 1) {
    outerMostFrame =
         (InlinedFrameLayout *)
         (&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf));
    iVar6 = pIVar4->inlineDepth;
  }
  goto LAB_0055aefd;
LAB_0055af55:
  *(uint *)(&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf)) =
       *(uint *)(&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf)) &
       0xfffffff0;
  goto LAB_0055af5f;
}

Assistant:

void InlineeFrameRecord::RestoreFrames(Js::FunctionBody* functionBody, InlinedFrameLayout* outerMostFrame, Js::JavascriptCallStackLayout* callstack, bool boxValues)
{
    InlineeFrameRecord* innerMostRecord = this;
    class AutoReverse
    {
    public:
        InlineeFrameRecord* record;
        AutoReverse(InlineeFrameRecord* record)
        {
            this->record = record->Reverse();
        }

        ~AutoReverse()
        {
            record->Reverse();
        }
    } autoReverse(innerMostRecord);

    InlineeFrameRecord* currentRecord = autoReverse.record;
    InlinedFrameLayout* currentFrame = outerMostFrame;

    int inlineDepth = 1;

    // Find an inlined frame that needs to be restored.
    while (currentFrame->callInfo.Count != 0)
    {
        inlineDepth++;
        currentFrame = currentFrame->Next();
    }
    // Align the inline depth of the record with the frame that needs to be restored
    while (currentRecord && currentRecord->inlineDepth != inlineDepth)
    {
        currentRecord = currentRecord->parent;
    }
    int currentDepth = inlineDepth;

    // Return if there is nothing to restore
    if (!currentRecord)
    {
        return;
    }

    // We have InlineeFrameRecords for optimized frames and parents (i.e. inlinees) of optimized frames
    // InlineeFrameRecords for unoptimized frames don't have values to restore and have argCount 0
    while (currentRecord && (currentRecord->argCount != 0 || currentRecord->parent))
    {
        // There is nothing to restore for unoptimized frames
        if (currentRecord->argCount != 0)
        {
            currentRecord->Restore(functionBody, currentFrame, callstack, boxValues);
        }
        currentRecord = currentRecord->parent;

        // Walk stack frames forward to the depth of the next record
        if (currentRecord)
        {
            while (currentDepth != currentRecord->inlineDepth)
            {
                currentFrame = currentFrame->Next();
                currentDepth++;
            }
        }
    }
    
    // If we don't have any more InlineeFrameRecords, the innermost inlinee was an optimized frame
    if (!currentRecord)
    {
        // We determine the innermost inlinee by frame->Next()->callInfo.Count == 0
        // Optimized frames don't have this set when entering inlinee in the JITed code, so we must do
        // this for them now
        currentFrame->Next()->callInfo.Count = 0;
    }
}